

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O1

JSONNode * __thiscall JSONNode::operator[](JSONNode *this,json_index_t pos)

{
  internalJSONNode *orig;
  
  orig = this->internal;
  if (1 < orig->refcount) {
    orig->refcount = orig->refcount - 1;
    orig = internalJSONNode::newInternal(orig);
  }
  this->internal = orig;
  internalJSONNode::Fetch(orig);
  return orig->Children->array[pos];
}

Assistant:

JSONNode & JSONNode::operator[](json_index_t pos) json_nothrow {
    JSON_CHECK_INTERNAL();
    JSON_ASSERT(pos < internal -> size(), JSON_TEXT("[] out of bounds"));
    makeUniqueInternal();
    return *(internal -> at(pos));
}